

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O0

void fy_parser_diag_vreport(fy_parser *fyp,fy_diag_report_ctx *fydrc,char *fmt,__va_list_tag *ap)

{
  fy_diag *diag_00;
  fy_diag *diag;
  __va_list_tag *ap_local;
  char *fmt_local;
  fy_diag_report_ctx *fydrc_local;
  fy_parser *fyp_local;
  
  if ((((fyp != (fy_parser *)0x0) && (fyp->diag != (fy_diag *)0x0)) &&
      (fydrc != (fy_diag_report_ctx *)0x0)) && (fmt != (char *)0x0)) {
    diag_00 = fyp->diag;
    fy_diag_vreport(diag_00,fydrc,fmt,ap);
    if (((fyp != (fy_parser *)0x0) && ((*(ushort *)&fyp->field_0x70 >> 4 & 1) == 0)) &&
       ((diag_00->field_0x3c & 1) != 0)) {
      *(ushort *)&fyp->field_0x70 = *(ushort *)&fyp->field_0x70 & 0xffef | 0x10;
    }
  }
  return;
}

Assistant:

void fy_parser_diag_vreport(struct fy_parser *fyp,
                            const struct fy_diag_report_ctx *fydrc,
                            const char *fmt, va_list ap) {
    struct fy_diag *diag;

    if (!fyp || !fyp->diag || !fydrc || !fmt)
        return;

    diag = fyp->diag;

    fy_diag_vreport(diag, fydrc, fmt, ap);

    if (fyp && !fyp->stream_error && diag->on_error)
        fyp->stream_error = true;
}